

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool isNewLine(shared_ptr<Readable> *reader,size_t i)

{
  int iVar1;
  element_type *peVar2;
  bool local_1a;
  bool local_19;
  size_t i_local;
  shared_ptr<Readable> *reader_local;
  
  peVar2 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      reader);
  iVar1 = (*peVar2->_vptr_Readable[2])(peVar2,i);
  local_19 = true;
  if ((char)iVar1 != '\n') {
    peVar2 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        reader);
    iVar1 = (*peVar2->_vptr_Readable[2])(peVar2,i);
    local_19 = true;
    if ((char)iVar1 != '\r') {
      peVar2 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )reader);
      iVar1 = (*peVar2->_vptr_Readable[2])(peVar2,i);
      local_1a = false;
      if ((char)iVar1 == '\r') {
        peVar2 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)reader);
        iVar1 = (*peVar2->_vptr_Readable[2])(peVar2,i + 1);
        local_1a = (char)iVar1 == '\n';
      }
      local_19 = local_1a;
    }
  }
  return local_19;
}

Assistant:

bool isNewLine(const std::shared_ptr<Readable>& reader, std::size_t i) {
  return
    reader->charAt(i) == '\n'
    || reader->charAt(i) == '\r'
    || (reader->charAt(i) == '\r' && reader->charAt(i + 1) == '\n');
}